

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O0

int arm_mmu_idx_to_el_aarch64(ARMMMUIdx mmu_idx)

{
  ARMMMUIdx local_c;
  ARMMMUIdx mmu_idx_local;
  
  if ((mmu_idx & ARMMMUIdx_MUser) == 0) {
    if (9 < mmu_idx - ARMMMUIdx_E10_0 && mmu_idx != ARMMMUIdx_SE3) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/helper.c"
                 ,0x2ce7,(char *)0x0);
    }
    switch((long)&switchD_00708eb4::switchdataD_01376420 +
           (long)(int)(&switchD_00708eb4::switchdataD_01376420)[mmu_idx - ARMMMUIdx_E10_0]) {
    case 0x708eb6:
      local_c = 0;
      break;
    default:
      local_c = 1;
      break;
    case 0x708ec8:
      local_c = 2;
      break;
    case 0x708ed1:
      local_c = 3;
    }
  }
  else {
    local_c = mmu_idx & 1;
  }
  return local_c;
}

Assistant:

int arm_mmu_idx_to_el(ARMMMUIdx mmu_idx)
{
    if (mmu_idx & ARM_MMU_IDX_M) {
        return mmu_idx & ARM_MMU_IDX_M_PRIV;
    }

    switch (mmu_idx) {
    case ARMMMUIdx_E10_0:
    case ARMMMUIdx_E20_0:
    case ARMMMUIdx_SE10_0:
        return 0;
    case ARMMMUIdx_E10_1:
    case ARMMMUIdx_E10_1_PAN:
    case ARMMMUIdx_SE10_1:
    case ARMMMUIdx_SE10_1_PAN:
        return 1;
    case ARMMMUIdx_E2:
    case ARMMMUIdx_E20_2:
    case ARMMMUIdx_E20_2_PAN:
        return 2;
    case ARMMMUIdx_SE3:
        return 3;
    default:
        g_assert_not_reached();
        // never reach here
        return 0;
    }
}